

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-color.cpp
# Opt level: O2

Color * gepard::Color::fromRawDataABGR(Color *__return_storage_ptr__,uint32_t raw)

{
  Color(__return_storage_ptr__,(double)(raw & 0xff) / 255.0,(double)(raw >> 8 & 0xff) / 255.0,
        (double)(raw >> 0x10 & 0xff) / 255.0,(double)(raw >> 0x18) / 255.0);
  return __return_storage_ptr__;
}

Assistant:

Color Color::fromRawDataABGR(const uint32_t raw)
{
    const Float red = Float(raw & 0x000000ff) / 255.0f;
    const Float green = Float((raw & 0x00ff00) >> 8) / 255.0f;
    const Float blue = Float((raw & 0x00ff0000) >> 16) / 255.0f;
    const Float alpha = Float((raw & 0xff000000) >> 24) / 255.0f;
    return Color(red, green, blue, alpha);
}